

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall btMatrixX<float>::setZero(btMatrixX<float> *this)

{
  int n;
  float *a;
  CProfileSample *in_RDI;
  CProfileSample __profile;
  char *in_stack_ffffffffffffffd8;
  
  CProfileSample::CProfileSample(in_RDI,in_stack_ffffffffffffffd8);
  a = btAlignedObjectArray<float>::operator[]((btAlignedObjectArray<float> *)(in_RDI + 0x18),0);
  n = btAlignedObjectArray<float>::size((btAlignedObjectArray<float> *)(in_RDI + 0x18));
  btSetZero<float>(a,n);
  CProfileSample::~CProfileSample((CProfileSample *)0x26397d);
  return;
}

Assistant:

void setZero()
	{
		{
			BT_PROFILE("storage=0");
			btSetZero(&m_storage[0],m_storage.size());
			//memset(&m_storage[0],0,sizeof(T)*m_storage.size());
			//for (int i=0;i<m_storage.size();i++)
	//			m_storage[i]=0;
		}
	}